

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fdb_functional_test.cc
# Opt level: O2

void api_wrapper_test(void)

{
  fdb_kvs_handle *pfVar1;
  void *ptr;
  fdb_status fVar2;
  int iVar3;
  size_t sVar4;
  size_t valuelen_00;
  uint uVar5;
  char *__format;
  fdb_kvs_handle *db;
  void *value;
  size_t valuelen;
  fdb_file_handle *dbfile;
  timeval __test_begin;
  fdb_kvs_config kvs_config;
  char keybuf [256];
  char temp [256];
  fdb_config fconfig;
  char bodybuf [256];
  
  gettimeofday((timeval *)&__test_begin,(__timezone_ptr_t)0x0);
  memleak_start();
  system("rm -rf  dummy* > errorlog.txt");
  fdb_get_default_config();
  fdb_get_default_kvs_config();
  fconfig.buffercache_size = 0;
  fconfig.wal_threshold = 0x400;
  fconfig.flags = 1;
  fconfig.purging_interval = 0;
  fconfig.compaction_threshold = '\0';
  fdb_open(&dbfile,"./dummy1",&fconfig);
  fdb_kvs_open_default(dbfile,&db,&kvs_config);
  fVar2 = fdb_set_log_callback(db,logCallbackFunc,"api_wrapper_test");
  if (fVar2 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
            ,0xd5b);
    api_wrapper_test()::__test_pass = 1;
    __assert_fail("status == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                  ,0xd5b,"void api_wrapper_test()");
  }
  fVar2 = fdb_set_kv(db,(void *)0x0,0,(void *)0x0,0);
  if (fVar2 != FDB_RESULT_INVALID_ARGS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
            ,0xd5f);
    api_wrapper_test()::__test_pass = 1;
    __assert_fail("status == FDB_RESULT_INVALID_ARGS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                  ,0xd5f,"void api_wrapper_test()");
  }
  uVar5 = 0;
  while (uVar5 != 10) {
    sprintf(keybuf,"key%d",(ulong)uVar5);
    sprintf(bodybuf,"body%d",(ulong)uVar5);
    pfVar1 = db;
    sVar4 = strlen(keybuf);
    valuelen_00 = strlen(bodybuf);
    fVar2 = fdb_set_kv(pfVar1,keybuf,sVar4,bodybuf,valuelen_00);
    uVar5 = uVar5 + 1;
    if (fVar2 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
              ,0xd66);
      api_wrapper_test()::__test_pass = 1;
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                    ,0xd66,"void api_wrapper_test()");
    }
  }
  sprintf(keybuf,"key%d",5);
  pfVar1 = db;
  sVar4 = strlen(keybuf);
  fVar2 = fdb_del_kv(pfVar1,keybuf,sVar4);
  if (fVar2 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
            ,0xd6c);
    api_wrapper_test()::__test_pass = 1;
    __assert_fail("status == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                  ,0xd6c,"void api_wrapper_test()");
  }
  fVar2 = fdb_del_kv(db,(void *)0x0,0);
  if (fVar2 == FDB_RESULT_INVALID_ARGS) {
    uVar5 = 0;
    do {
      if (uVar5 == 10) {
        fVar2 = fdb_get_kv(db,(void *)0x0,0,&value,&valuelen);
        pfVar1 = db;
        if (fVar2 != FDB_RESULT_INVALID_ARGS) {
          fprintf(_stderr,"Test failed: %s %d\n",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                  ,0xd85);
          api_wrapper_test()::__test_pass = 1;
          __assert_fail("status == FDB_RESULT_INVALID_ARGS",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                        ,0xd85,"void api_wrapper_test()");
        }
        sVar4 = strlen(keybuf);
        fVar2 = fdb_get_kv(pfVar1,keybuf,sVar4,(void **)0x0,(size_t *)0x0);
        if (fVar2 == FDB_RESULT_INVALID_ARGS) {
          fdb_kvs_close(db);
          fdb_close(dbfile);
          fdb_shutdown();
          memleak_end();
          __format = "%s PASSED\n";
          if (api_wrapper_test()::__test_pass != '\0') {
            __format = "%s FAILED\n";
          }
          fprintf(_stderr,__format,"API wrapper test");
          return;
        }
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                ,0xd88);
        api_wrapper_test()::__test_pass = 1;
        __assert_fail("status == FDB_RESULT_INVALID_ARGS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                      ,0xd88,"void api_wrapper_test()");
      }
      sprintf(keybuf,"key%d",(ulong)uVar5);
      pfVar1 = db;
      sVar4 = strlen(keybuf);
      fVar2 = fdb_get_kv(pfVar1,keybuf,sVar4,&value,&valuelen);
      if (uVar5 == 5) {
        if (fVar2 != FDB_RESULT_KEY_NOT_FOUND) {
          fprintf(_stderr,"Test failed: %s %d\n",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                  ,0xd7f);
          api_wrapper_test()::__test_pass = 1;
          __assert_fail("status == FDB_RESULT_KEY_NOT_FOUND",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                        ,0xd7f,"void api_wrapper_test()");
        }
      }
      else {
        if (fVar2 != FDB_RESULT_SUCCESS) {
          fprintf(_stderr,"Test failed: %s %d\n",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                  ,0xd79);
          api_wrapper_test()::__test_pass = 1;
          __assert_fail("status == FDB_RESULT_SUCCESS",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                        ,0xd79,"void api_wrapper_test()");
        }
        sprintf(temp,"body%d",(ulong)uVar5);
        ptr = value;
        iVar3 = bcmp(value,temp,valuelen);
        if (iVar3 != 0) {
          fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",temp,ptr,
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                  ,0xd7b);
          api_wrapper_test()::__test_pass = 1;
          __assert_fail("false",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                        ,0xd7b,"void api_wrapper_test()");
        }
        fdb_free_block(ptr);
      }
      uVar5 = uVar5 + 1;
    } while( true );
  }
  fprintf(_stderr,"Test failed: %s %d\n",
          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
          ,0xd70);
  api_wrapper_test()::__test_pass = 1;
  __assert_fail("status == FDB_RESULT_INVALID_ARGS",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                ,0xd70,"void api_wrapper_test()");
}

Assistant:

void api_wrapper_test()
{
    TEST_INIT();

    memleak_start();

    int i, r;
    int n = 10;
    size_t valuelen;
    void *value;
    fdb_file_handle *dbfile;
    fdb_kvs_handle *db;
    fdb_status status;

    char keybuf[256], bodybuf[256], temp[256];

    // remove previous dummy files
    r = system(SHELL_DEL" dummy* > errorlog.txt");
    (void)r;

    fdb_config fconfig = fdb_get_default_config();
    fdb_kvs_config kvs_config = fdb_get_default_kvs_config();
    fconfig.buffercache_size = 0;
    fconfig.wal_threshold = 1024;
    fconfig.flags = FDB_OPEN_FLAG_CREATE;
    fconfig.purging_interval = 0;
    fconfig.compaction_threshold = 0;

    // open db
    fdb_open(&dbfile, "./dummy1", &fconfig);
    fdb_kvs_open_default(dbfile, &db, &kvs_config);
    status = fdb_set_log_callback(db, logCallbackFunc,
                                  (void *) "api_wrapper_test");
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // error check
    status = fdb_set_kv(db, NULL, 0, NULL, 0);
    TEST_CHK(status == FDB_RESULT_INVALID_ARGS);

    // insert key-value pairs
    for (i=0;i<n;++i){
        sprintf(keybuf, "key%d", i);
        sprintf(bodybuf, "body%d", i);
        status = fdb_set_kv(db, keybuf, strlen(keybuf), bodybuf, strlen(bodybuf));
        TEST_CHK(status == FDB_RESULT_SUCCESS);
    }

    // remove key5
    sprintf(keybuf, "key%d", 5);
    status = fdb_del_kv(db, keybuf, strlen(keybuf));
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // error check
    status = fdb_del_kv(db, NULL, 0);
    TEST_CHK(status == FDB_RESULT_INVALID_ARGS);

    // retrieve key-value pairs
    for (i=0;i<n;++i){
        sprintf(keybuf, "key%d", i);
        status = fdb_get_kv(db, keybuf, strlen(keybuf), &value, &valuelen);

        if (i != 5) {
            // updated documents
            TEST_CHK(status == FDB_RESULT_SUCCESS);
            sprintf(temp, "body%d", i);
            TEST_CMP(value, temp, valuelen);
            fdb_free_block(value);
        } else {
            // removed document
            TEST_CHK(status == FDB_RESULT_KEY_NOT_FOUND);
        }
    }

    // error check
    status = fdb_get_kv(db, NULL, 0, &value, &valuelen);
    TEST_CHK(status == FDB_RESULT_INVALID_ARGS);

    status = fdb_get_kv(db, keybuf, strlen(keybuf), NULL, NULL);
    TEST_CHK(status == FDB_RESULT_INVALID_ARGS);

    // close db file
    fdb_kvs_close(db);
    fdb_close(dbfile);

    // free all resources
    fdb_shutdown();

    memleak_end();

    TEST_RESULT("API wrapper test");
}